

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O0

void RDL_swap_columns(uchar **rows,uint nof_rows,uint col1,uint col2)

{
  uchar uVar1;
  uchar uVar2;
  uint local_24;
  uint i;
  uchar val2;
  uchar val1;
  uint col2_local;
  uint col1_local;
  uint nof_rows_local;
  uchar **rows_local;
  
  for (local_24 = 0; local_24 < nof_rows; local_24 = local_24 + 1) {
    uVar1 = RDL_bitset_test(rows[local_24],col1);
    uVar2 = RDL_bitset_test(rows[local_24],col2);
    if ((uVar1 == '\0') != (uVar2 == '\0')) {
      RDL_bitset_flip(rows[local_24],col1);
      RDL_bitset_flip(rows[local_24],col2);
    }
  }
  return;
}

Assistant:

void RDL_swap_columns(unsigned char** rows, unsigned nof_rows, unsigned col1, unsigned col2)
{
  unsigned char val1, val2;
  unsigned i;

  for (i = 0; i < nof_rows; ++i) {
    val1 = RDL_bitset_test(rows[i], col1);
    val2 = RDL_bitset_test(rows[i], col2);

    if (!val1 != !val2) {
      RDL_bitset_flip(rows[i], col1);
      RDL_bitset_flip(rows[i], col2);
    }
  }
}